

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

uint __thiscall
Js::ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
          (Data *this,OpCodeAsmJs op,ByteCodeWriter *writer,bool isPatching)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint offset;
  bool isPatching_local;
  ByteCodeWriter *writer_local;
  OpCodeAsmJs op_local;
  Data *this_local;
  
  bVar2 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = OpCodeAttrAsmJs::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x13,
                                "(layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op))"
                                ,
                                "layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = GetCurrentOffset(this);
  EncodeOpCode<(Js::LayoutSize)1>(this,op,writer);
  if ((Ld_Db < op) || (op < Ld_IntConst)) {
    writer->m_byteCodeWithoutLDACount = writer->m_byteCodeWithoutLDACount + 1;
  }
  if (!isPatching) {
    IncreaseByteCodeCount(writer);
  }
  return uVar3;
}

Assistant:

inline uint ByteCodeWriter::Data::EncodeT(OpCodeAsmJs op, ByteCodeWriter* writer, bool isPatching)
    {
        Assert(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op));

        Assert(layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op));
        // Capture offset before encoding the opcode
        uint offset = GetCurrentOffset();
        EncodeOpCode<layoutSize>((ushort)op, writer);

        if (op > Js::OpCodeAsmJs::Ld_Db || op < Js::OpCodeAsmJs::Ld_IntConst)
        {
            writer->m_byteCodeWithoutLDACount++;
        }
        CompileAssert((int)Js::OpCodeAsmJs::Ld_Db - (int)Js::OpCodeAsmJs::Ld_IntConst == 7);

        if (!isPatching)
        {
            writer->IncreaseByteCodeCount();
        }
        return offset;
    }